

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O1

void __thiscall
btGeneric6DofSpring2Constraint::getInfo1
          (btGeneric6DofSpring2Constraint *this,btConstraintInfo1 *info)

{
  int iVar1;
  long lVar2;
  int iVar3;
  bool *pbVar4;
  
  calculateTransforms(this,&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                            m_worldTransform,
                      &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                       m_worldTransform);
  info->m_numConstraintRows = 0;
  info->nub = 0;
  lVar2 = 0x330;
  do {
    iVar1 = *(int *)((long)this + lVar2 * 4 + -0x8ec);
    if (iVar1 != 0) {
      iVar3 = 2;
      if (iVar1 != 4) {
        iVar3 = 1;
      }
      info->m_numConstraintRows = info->m_numConstraintRows + iVar3;
    }
    if (*(char *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar2 + -0x48) == '\x01') {
      info->m_numConstraintRows = info->m_numConstraintRows + 1;
    }
    if (*(char *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar2 + -0x42) == '\x01') {
      info->m_numConstraintRows = info->m_numConstraintRows + 1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x333);
  pbVar4 = &this->m_angularLimits[0].m_enableMotor;
  lVar2 = 0;
  do {
    testAngularLimitMotor(this,(int)lVar2);
    if (*(int *)(pbVar4 + 0x38) != 0) {
      iVar1 = 2;
      if (*(int *)(pbVar4 + 0x38) != 4) {
        iVar1 = 1;
      }
      info->m_numConstraintRows = info->m_numConstraintRows + iVar1;
    }
    if (*pbVar4 == true) {
      info->m_numConstraintRows = info->m_numConstraintRows + 1;
    }
    if (pbVar4[0x14] == true) {
      info->m_numConstraintRows = info->m_numConstraintRows + 1;
    }
    lVar2 = lVar2 + 1;
    pbVar4 = pbVar4 + 0x58;
  } while (lVar2 != 3);
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::getInfo1 (btConstraintInfo1* info)
{
	//prepare constraint
	calculateTransforms(m_rbA.getCenterOfMassTransform(),m_rbB.getCenterOfMassTransform());
	info->m_numConstraintRows = 0;
	info->nub = 0;
	int i;
	//test linear limits
	for(i = 0; i < 3; i++)
	{
		     if (m_linearLimits.m_currentLimit[i]==4) info->m_numConstraintRows += 2;
		else if (m_linearLimits.m_currentLimit[i]!=0) info->m_numConstraintRows += 1;
		if (m_linearLimits.m_enableMotor[i] ) info->m_numConstraintRows += 1;
		if (m_linearLimits.m_enableSpring[i]) info->m_numConstraintRows += 1;
	}
	//test angular limits
	for (i=0;i<3 ;i++ )
	{
		testAngularLimitMotor(i);
		     if (m_angularLimits[i].m_currentLimit==4) info->m_numConstraintRows += 2;
		else if (m_angularLimits[i].m_currentLimit!=0) info->m_numConstraintRows += 1;
		if (m_angularLimits[i].m_enableMotor ) info->m_numConstraintRows += 1;
		if (m_angularLimits[i].m_enableSpring) info->m_numConstraintRows += 1;
	}
}